

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiDockNode::ImGuiDockNode(ImGuiDockNode *this,ImGuiID id)

{
  (this->Windows).Size = 0;
  (this->Windows).Capacity = 0;
  (this->Windows).Data = (ImGuiWindow_conflict **)0x0;
  (this->WindowClass).ViewportFlagsOverrideClear = 0;
  (this->WindowClass).TabItemFlagsOverrideSet = 0;
  (this->WindowClass).DockNodeFlagsOverrideSet = 0;
  (this->WindowClass).DockingAlwaysTabBar = false;
  (this->WindowClass).DockingAllowUnclassed = false;
  *(undefined2 *)&(this->WindowClass).field_0x1a = 0;
  (this->WindowClass).ClassId = 0;
  (this->WindowClass).ParentViewportId = 0;
  (this->WindowClass).ViewportFlagsOverrideSet = 0;
  (this->WindowClass).ViewportFlagsOverrideClear = 0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeRef).x = 0.0;
  (this->SizeRef).y = 0.0;
  (this->WindowClass).DockingAllowUnclassed = true;
  this->ID = id;
  this->TabBar = (ImGuiTabBar *)0x0;
  this->SharedFlags = 0;
  this->LocalFlags = 0;
  this->LocalFlagsInWindows = 0;
  this->MergedFlags = 0;
  this->ParentNode = (ImGuiDockNode *)0x0;
  this->ChildNodes[0] = (ImGuiDockNode *)0x0;
  this->ChildNodes[1] = (ImGuiDockNode *)0x0;
  this->SplitAxis = ImGuiAxis_None;
  this->State = ImGuiDockNodeState_Unknown;
  this->HostWindow = (ImGuiWindow_conflict *)0x0;
  this->VisibleWindow = (ImGuiWindow_conflict *)0x0;
  this->CentralNode = (ImGuiDockNode *)0x0;
  this->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  this->CountNodeWithWindows = 0;
  this->LastFrameAlive = -1;
  this->LastFrameActive = -1;
  this->LastFrameFocused = -1;
  this->LastFocusedNodeId = 0;
  this->SelectedTabId = 0;
  this->WantCloseTabId = 0;
  *(undefined2 *)&this->field_0xbc = 0x209;
  this->field_0xbe = this->field_0xbe & 0xf0;
  return;
}

Assistant:

inline ~ImVector()                                      { if (Data) IM_FREE(Data); }